

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

int av1_check_trailing_bits(AV1Decoder *pbi,aom_read_bit_buffer *rb)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = rb->bit_offset & 7;
  iVar1 = aom_rb_read_literal(rb,8 - uVar3);
  iVar2 = 0;
  if (iVar1 != 1 << ((byte)uVar3 ^ 7)) {
    (pbi->error).error_code = AOM_CODEC_CORRUPT_FRAME;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int av1_check_trailing_bits(AV1Decoder *pbi, struct aom_read_bit_buffer *rb) {
  // bit_offset is set to 0 (mod 8) when the reader is already byte aligned
  int bits_before_alignment = 8 - rb->bit_offset % 8;
  int trailing = aom_rb_read_literal(rb, bits_before_alignment);
  if (trailing != (1 << (bits_before_alignment - 1))) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    return -1;
  }
  return 0;
}